

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O0

Box * __thiscall amrex::FaceDivFree::CoarseBox(FaceDivFree *this,Box *fine,IntVect *ratio)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  Box *pBVar5;
  int iVar6;
  int *in_RCX;
  long *in_RDX;
  Box *in_RDI;
  Box result;
  int dir;
  IntVect off;
  int local_27c;
  int local_278;
  int local_274;
  int local_26c;
  int local_268;
  int local_264;
  int local_25c;
  int local_258;
  int local_254;
  int local_244;
  int local_240;
  int local_23c;
  int local_234;
  int local_230;
  int local_22c;
  int local_224;
  int local_220;
  int local_21c;
  int local_20c;
  int local_208;
  int local_204;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  bool local_1ad;
  Box local_1ac [2];
  int local_168;
  IntVect local_164;
  int *local_158;
  Box *local_150;
  int local_144;
  int *local_140;
  undefined4 local_134;
  int *local_128;
  IntVect *local_120;
  IntVect *local_110;
  Box *local_100;
  IndexType *local_f8;
  int local_ec;
  IndexType *local_e8;
  int local_dc;
  IntVect *local_d8;
  undefined4 local_d0;
  int local_cc;
  IntVect *local_c8;
  IntVect *local_c0;
  IntVect *local_b8;
  undefined4 local_ac;
  IntVect *local_a8;
  undefined4 local_9c;
  IntVect *local_98;
  undefined4 local_8c;
  IntVect *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  lVar1 = *in_RDX;
  lVar2 = in_RDX[1];
  lVar3 = in_RDX[2];
  local_1ac[0].btype.itype = *(uint *)(in_RDX + 3);
  local_150 = local_1ac;
  local_134 = 1;
  local_1ad = true;
  if ((*in_RCX == 1) && (local_1ad = true, in_RCX[1] == 1)) {
    local_1ad = in_RCX[2] != 1;
  }
  local_1ac[0].smallend.vect._0_8_ = lVar1;
  local_1ac[0]._8_8_ = lVar2;
  local_1ac[0].bigend.vect._4_8_ = lVar3;
  if (local_1ad) {
    local_1ac[0].smallend.vect[0] = (int)lVar1;
    local_64 = local_1ac[0].smallend.vect[0];
    local_68 = *in_RCX;
    local_60 = local_64;
    if (local_68 != 1) {
      if (local_68 == 2) {
        if (local_1ac[0].smallend.vect[0] < 0) {
          iVar6 = local_1ac[0].smallend.vect[0] + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_1e4 = -iVar6 / 2 + -1;
        }
        else {
          local_1e4 = local_1ac[0].smallend.vect[0] / 2;
        }
        local_60 = local_1e4;
      }
      else if (local_68 == 4) {
        if (local_1ac[0].smallend.vect[0] < 0) {
          iVar6 = local_1ac[0].smallend.vect[0] + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_1e8 = -iVar6 / 4 + -1;
        }
        else {
          local_1e8 = local_1ac[0].smallend.vect[0] / 4;
        }
        local_60 = local_1e8;
      }
      else {
        if (local_1ac[0].smallend.vect[0] < 0) {
          iVar6 = local_1ac[0].smallend.vect[0] + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_1ec = -iVar6 / local_68 + -1;
        }
        else {
          local_1ec = local_1ac[0].smallend.vect[0] / local_68;
        }
        local_60 = local_1ec;
      }
    }
    local_1ac[0].smallend.vect[1] = (int)((ulong)lVar1 >> 0x20);
    local_70 = local_1ac[0].smallend.vect[1];
    local_1ac[0].smallend.vect[0] = local_60;
    local_74 = in_RCX[1];
    local_6c = local_70;
    if (local_74 != 1) {
      if (local_74 == 2) {
        if (lVar1 < 0) {
          iVar6 = local_70 + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_1f4 = -iVar6 / 2 + -1;
        }
        else {
          local_1f4 = local_70 / 2;
        }
        local_6c = local_1f4;
      }
      else if (local_74 == 4) {
        if (lVar1 < 0) {
          iVar6 = local_70 + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_1f8 = -iVar6 / 4 + -1;
        }
        else {
          local_1f8 = local_70 / 4;
        }
        local_6c = local_1f8;
      }
      else {
        if (lVar1 < 0) {
          iVar6 = local_70 + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_1fc = -iVar6 / local_74 + -1;
        }
        else {
          local_1fc = local_70 / local_74;
        }
        local_6c = local_1fc;
      }
    }
    local_1ac[0].smallend.vect[1] = local_6c;
    local_1ac[0].smallend.vect[2] = (int)lVar2;
    local_7c = local_1ac[0].smallend.vect[2];
    local_80 = in_RCX[2];
    local_78 = local_7c;
    if (local_80 != 1) {
      if (local_80 == 2) {
        if (local_1ac[0].smallend.vect[2] < 0) {
          iVar6 = local_1ac[0].smallend.vect[2] + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_204 = -iVar6 / 2 + -1;
        }
        else {
          local_204 = local_1ac[0].smallend.vect[2] / 2;
        }
        local_78 = local_204;
      }
      else if (local_80 == 4) {
        if (local_1ac[0].smallend.vect[2] < 0) {
          iVar6 = local_1ac[0].smallend.vect[2] + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_208 = -iVar6 / 4 + -1;
        }
        else {
          local_208 = local_1ac[0].smallend.vect[2] / 4;
        }
        local_78 = local_208;
      }
      else {
        if (local_1ac[0].smallend.vect[2] < 0) {
          iVar6 = local_1ac[0].smallend.vect[2] + 1;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          local_20c = -iVar6 / local_80 + -1;
        }
        else {
          local_20c = local_1ac[0].smallend.vect[2] / local_80;
        }
        local_78 = local_20c;
      }
    }
    local_1ac[0].bigend.vect[0] = (int)((ulong)lVar2 >> 0x20);
    local_25c = local_1ac[0].bigend.vect[0];
    local_1ac[0].smallend.vect[2] = local_78;
    local_f8 = &local_1ac[0].btype;
    local_100 = local_150;
    if (local_1ac[0].btype.itype == 0) {
      local_110 = &local_1ac[0].bigend;
      local_40 = local_25c;
      local_44 = *in_RCX;
      local_3c = local_40;
      if (local_44 != 1) {
        if (local_44 == 2) {
          if (lVar2 < 0) {
            local_25c = local_25c + 1;
            if (local_25c < 1) {
              local_25c = -local_25c;
            }
            local_254 = -local_25c / 2 + -1;
          }
          else {
            local_254 = local_25c / 2;
          }
          local_3c = local_254;
        }
        else if (local_44 == 4) {
          if (lVar2 < 0) {
            local_25c = local_25c + 1;
            if (local_25c < 1) {
              local_25c = -local_25c;
            }
            local_258 = -local_25c / 4 + -1;
          }
          else {
            local_258 = local_25c / 4;
          }
          local_3c = local_258;
        }
        else {
          if (lVar2 < 0) {
            local_25c = local_25c + 1;
            if (local_25c < 1) {
              local_25c = -local_25c;
            }
            local_25c = -local_25c / local_44 + -1;
          }
          else {
            local_25c = local_25c / local_44;
          }
          local_3c = local_25c;
        }
      }
      local_1ac[0].bigend.vect[0] = local_3c;
      local_1ac[0].bigend.vect[1] = (int)lVar3;
      local_4c = local_1ac[0].bigend.vect[1];
      local_50 = in_RCX[1];
      local_48 = local_4c;
      if (local_50 != 1) {
        if (local_50 == 2) {
          if (local_1ac[0].bigend.vect[1] < 0) {
            iVar6 = local_1ac[0].bigend.vect[1] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_264 = -iVar6 / 2 + -1;
          }
          else {
            local_264 = local_1ac[0].bigend.vect[1] / 2;
          }
          local_48 = local_264;
        }
        else if (local_50 == 4) {
          if (local_1ac[0].bigend.vect[1] < 0) {
            iVar6 = local_1ac[0].bigend.vect[1] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_268 = -iVar6 / 4 + -1;
          }
          else {
            local_268 = local_1ac[0].bigend.vect[1] / 4;
          }
          local_48 = local_268;
        }
        else {
          if (local_1ac[0].bigend.vect[1] < 0) {
            iVar6 = local_1ac[0].bigend.vect[1] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_26c = -iVar6 / local_50 + -1;
          }
          else {
            local_26c = local_1ac[0].bigend.vect[1] / local_50;
          }
          local_48 = local_26c;
        }
      }
      local_1ac[0].bigend.vect[2] = (int)((ulong)lVar3 >> 0x20);
      local_58 = local_1ac[0].bigend.vect[2];
      local_1ac[0].bigend.vect[1] = local_48;
      local_5c = in_RCX[2];
      local_54 = local_58;
      if (local_5c != 1) {
        if (local_5c == 2) {
          if (lVar3 < 0) {
            iVar6 = local_58 + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_274 = -iVar6 / 2 + -1;
          }
          else {
            local_274 = local_58 / 2;
          }
          local_54 = local_274;
        }
        else if (local_5c == 4) {
          if (lVar3 < 0) {
            iVar6 = local_58 + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_278 = -iVar6 / 4 + -1;
          }
          else {
            local_278 = local_58 / 4;
          }
          local_54 = local_278;
        }
        else {
          if (lVar3 < 0) {
            iVar6 = local_58 + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_27c = -iVar6 / local_5c + -1;
          }
          else {
            local_27c = local_58 / local_5c;
          }
          local_54 = local_27c;
        }
      }
      local_1ac[0].bigend.vect[2] = local_54;
      local_1ac[0]._8_8_ = local_1ac[0]._8_8_;
      local_1ac[0].bigend.vect._4_8_ = local_1ac[0].bigend.vect._4_8_;
    }
    else {
      local_158 = in_RCX;
      IntVect::IntVect(&local_164,0);
      uVar4 = local_1ac[0].bigend.vect._4_8_;
      for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
        local_e8 = &local_1ac[0].btype;
        local_ec = local_168;
        local_14 = local_168;
        local_4 = local_168;
        if ((local_1ac[0].btype.itype & 1 << ((byte)local_168 & 0x1f)) != 0) {
          local_d8 = &local_1ac[0].bigend;
          local_dc = local_168;
          local_140 = local_158;
          local_144 = local_168;
          if (local_d8->vect[local_168] % local_158[local_168] != 0) {
            local_c8 = &local_164;
            local_cc = local_168;
            local_d0 = 1;
            local_c8->vect[local_168] = 1;
          }
        }
        local_10 = local_e8;
      }
      local_120 = &local_1ac[0].bigend;
      local_128 = local_158;
      local_1c = local_1ac[0].bigend.vect[0];
      local_20 = *local_158;
      local_18 = local_1c;
      if (local_20 != 1) {
        if (local_20 == 2) {
          if ((long)local_1ac[0]._8_8_ < 0) {
            iVar6 = local_1ac[0].bigend.vect[0] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_21c = -iVar6 / 2 + -1;
          }
          else {
            local_21c = local_1ac[0].bigend.vect[0] / 2;
          }
          local_18 = local_21c;
        }
        else if (local_20 == 4) {
          if ((long)local_1ac[0]._8_8_ < 0) {
            iVar6 = local_1ac[0].bigend.vect[0] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_220 = -iVar6 / 4 + -1;
          }
          else {
            local_220 = local_1ac[0].bigend.vect[0] / 4;
          }
          local_18 = local_220;
        }
        else {
          if ((long)local_1ac[0]._8_8_ < 0) {
            iVar6 = local_1ac[0].bigend.vect[0] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_224 = -iVar6 / local_20 + -1;
          }
          else {
            local_224 = local_1ac[0].bigend.vect[0] / local_20;
          }
          local_18 = local_224;
        }
      }
      local_1ac[0].bigend.vect[0] = local_18;
      local_28 = local_1ac[0].bigend.vect[1];
      local_2c = local_158[1];
      local_24 = local_28;
      if (local_2c != 1) {
        if (local_2c == 2) {
          if (local_1ac[0].bigend.vect[1] < 0) {
            iVar6 = local_1ac[0].bigend.vect[1] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_22c = -iVar6 / 2 + -1;
          }
          else {
            local_22c = local_1ac[0].bigend.vect[1] / 2;
          }
          local_24 = local_22c;
        }
        else if (local_2c == 4) {
          if (local_1ac[0].bigend.vect[1] < 0) {
            iVar6 = local_1ac[0].bigend.vect[1] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_230 = -iVar6 / 4 + -1;
          }
          else {
            local_230 = local_1ac[0].bigend.vect[1] / 4;
          }
          local_24 = local_230;
        }
        else {
          if (local_1ac[0].bigend.vect[1] < 0) {
            iVar6 = local_1ac[0].bigend.vect[1] + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_234 = -iVar6 / local_2c + -1;
          }
          else {
            local_234 = local_1ac[0].bigend.vect[1] / local_2c;
          }
          local_24 = local_234;
        }
      }
      local_34 = local_1ac[0].bigend.vect[2];
      local_1ac[0].bigend.vect[1] = local_24;
      local_38 = local_158[2];
      local_30 = local_34;
      if (local_38 != 1) {
        if (local_38 == 2) {
          if ((long)uVar4 < 0) {
            iVar6 = local_34 + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_23c = -iVar6 / 2 + -1;
          }
          else {
            local_23c = local_34 / 2;
          }
          local_30 = local_23c;
        }
        else if (local_38 == 4) {
          if ((long)uVar4 < 0) {
            iVar6 = local_34 + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_240 = -iVar6 / 4 + -1;
          }
          else {
            local_240 = local_34 / 4;
          }
          local_30 = local_240;
        }
        else {
          if ((long)uVar4 < 0) {
            iVar6 = local_34 + 1;
            if (iVar6 < 1) {
              iVar6 = -iVar6;
            }
            local_244 = -iVar6 / local_38 + -1;
          }
          else {
            local_244 = local_34 / local_38;
          }
          local_30 = local_244;
        }
      }
      local_1ac[0].bigend.vect[2] = local_30;
      local_b8 = &local_1ac[0].bigend;
      local_c0 = &local_164;
      local_8c = 0;
      local_1ac[0].bigend.vect[0] = local_164.vect[0] + local_1ac[0].bigend.vect[0];
      local_9c = 1;
      iVar6 = local_1ac[0].bigend.vect[2];
      local_1ac[0].bigend.vect[1] = local_164.vect[1] + local_1ac[0].bigend.vect[1];
      local_ac = 2;
      local_1ac[0].bigend.vect[2] = local_164.vect[2] + iVar6;
      local_1ac[0]._8_8_ = local_1ac[0]._8_8_;
      local_1ac[0].bigend.vect._4_8_ = local_1ac[0].bigend.vect._4_8_;
      local_a8 = local_c0;
      local_98 = local_c0;
      local_88 = local_c0;
    }
  }
  pBVar5 = Box::grow(local_1ac,1);
  *(undefined8 *)(in_RDI->smallend).vect = *(undefined8 *)(pBVar5->smallend).vect;
  *(undefined8 *)((in_RDI->smallend).vect + 2) = *(undefined8 *)((pBVar5->smallend).vect + 2);
  *(undefined8 *)((in_RDI->bigend).vect + 1) = *(undefined8 *)((pBVar5->bigend).vect + 1);
  (in_RDI->btype).itype = (pBVar5->btype).itype;
  return in_RDI;
}

Assistant:

Box
FaceDivFree::CoarseBox (const Box&     fine,
                        const IntVect& ratio)
{
    Box b = amrex::coarsen(fine,ratio).grow(1);
    return b;
}